

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_to_zero_after_compact_test(bool multi_kv)

{
  bool bVar1;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  __atomic_base<unsigned_long> metalen;
  long extraout_RDX;
  code *pcVar8;
  long lVar9;
  fdb_doc *ptr_handle;
  timeval *ptVar10;
  timeval *__tv;
  fdb_config *fconfig_00;
  fdb_kvs_handle **ppfVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  char *__s;
  fdb_kvs_handle *pfVar15;
  fdb_kvs_handle *pfVar16;
  fdb_kvs_handle *pfVar17;
  fdb_kvs_handle *pfVar18;
  undefined7 in_register_00000039;
  fdb_kvs_config *pfVar19;
  fdb_kvs_handle **ppfVar20;
  fdb_kvs_handle *unaff_R12;
  fdb_kvs_handle *unaff_R13;
  ulong uVar21;
  btree *doc_00;
  char cVar22;
  char *pcVar23;
  fdb_kvs_config *config;
  filemgr_ops *pfVar24;
  fdb_config *fconfig_01;
  fdb_kvs_handle **__s_00;
  btree **__s_01;
  fdb_doc *doc_01;
  fdb_doc *pfVar25;
  fdb_kvs_handle *doc_02;
  fdb_kvs_handle *pfVar26;
  fdb_file_handle *dbfile;
  fdb_file_handle *dbfile_comp;
  fdb_kvs_handle *db [4];
  fdb_kvs_info info;
  char metabuf [64];
  char keybuf [64];
  fdb_kvs_config kvs_config;
  char kv_name [8];
  char bodybuf [64];
  timeval __test_begin;
  fdb_doc *doc [20];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_4a18;
  fdb_kvs_handle *pfStack_4a10;
  fdb_file_handle *pfStack_4a08;
  fdb_iterator *pfStack_4a00;
  fdb_doc *pfStack_49f8;
  fdb_kvs_handle *pfStack_49f0;
  timeval tStack_49e8;
  fdb_kvs_config fStack_49d8;
  fdb_config fStack_49c0;
  fdb_config *pfStack_48c8;
  fdb_kvs_handle *pfStack_48c0;
  fdb_kvs_handle *pfStack_48b8;
  fdb_file_handle *pfStack_48b0;
  fdb_kvs_handle *pfStack_48a8;
  char acStack_489f [15];
  filemgr *pfStack_4890;
  docio_handle *pdStack_4888;
  btreeblk_handle *pbStack_4880;
  size_t sStack_4878;
  filemgr *pfStack_4870;
  docio_handle *pdStack_4868;
  btreeblk_handle *pbStack_4860;
  timeval tStack_4858;
  undefined1 auStack_4848 [76];
  uint uStack_47fc;
  char *pcStack_4708;
  atomic<unsigned_long> aStack_4700;
  btree *pbStack_46f8;
  fdb_kvs_handle *pfStack_46f0;
  fdb_kvs_handle *pfStack_46e8;
  code *pcStack_46e0;
  uint uStack_46cc;
  fdb_txn *pfStack_46c8;
  fdb_kvs_handle *pfStack_46c0;
  fdb_iterator *pfStack_46b8;
  fdb_snapshot_info_t *pfStack_46b0;
  int iStack_46a4;
  fdb_kvs_handle *pfStack_46a0;
  fdb_kvs_handle *apfStack_4698 [3];
  uint64_t uStack_4680;
  fdb_kvs_config fStack_4678;
  char acStack_4660 [8];
  timeval tStack_4658;
  char acStack_4648 [256];
  btree bStack_4548;
  char acStack_44f8 [256];
  char acStack_43f8 [256];
  fdb_config fStack_42f8;
  fdb_kvs_handle **ppfStack_4200;
  fdb_kvs_handle **ppfStack_41f8;
  fdb_kvs_handle *pfStack_41f0;
  fdb_kvs_handle **ppfStack_41e8;
  fdb_kvs_handle *pfStack_41e0;
  code *pcStack_41d8;
  fdb_kvs_handle **ppfStack_41d0;
  fdb_kvs_handle *pfStack_41c8;
  fdb_kvs_handle *apfStack_41c0 [9];
  fdb_kvs_config fStack_4178;
  timeval tStack_4160;
  fdb_kvs_handle *apfStack_4150 [33];
  fdb_config fStack_4048;
  fdb_kvs_handle *apfStack_3f50 [32];
  fdb_kvs_handle *apfStack_3e50 [32];
  fdb_kvs_handle afStack_3d50 [15];
  fdb_config *pfStack_1d48;
  fdb_kvs_handle *pfStack_1d40;
  fdb_kvs_handle *pfStack_1d38;
  fdb_config *pfStack_1d30;
  fdb_kvs_handle *pfStack_1d28;
  fdb_kvs_handle *pfStack_1d20;
  fdb_kvs_handle *pfStack_1d10;
  fdb_file_handle *pfStack_1d08;
  fdb_iterator *pfStack_1d00;
  fdb_doc *pfStack_1cf8;
  fdb_kvs_handle *pfStack_1cf0;
  undefined1 auStack_1ce7 [31];
  undefined1 auStack_1cc8 [72];
  fdb_config fStack_1c80;
  timeval *ptStack_1b88;
  fdb_kvs_handle *pfStack_1b80;
  fdb_kvs_handle *pfStack_1b78;
  fdb_config *pfStack_1b70;
  fdb_kvs_handle *pfStack_1b68;
  int iStack_1b54;
  fdb_kvs_handle *pfStack_1b50;
  fdb_file_handle *pfStack_1b48;
  pthread_t pStack_1b40;
  undefined1 auStack_1b37 [63];
  undefined1 auStack_1af8 [16];
  uint64_t uStack_1ae8;
  fdb_config fStack_1a00;
  fdb_kvs_handle *pfStack_1900;
  fdb_kvs_handle *pfStack_18f8;
  filemgr_ops *pfStack_18f0;
  fdb_kvs_handle *pfStack_18e8;
  fdb_kvs_handle *pfStack_18e0;
  timeval tStack_18d0;
  fdb_kvs_handle *pfStack_18c0;
  fdb_kvs_handle *pfStack_18b8;
  fdb_kvs_handle *pfStack_18a8;
  fdb_kvs_handle *pfStack_18a0;
  fdb_kvs_handle *pfStack_1898;
  fdb_file_handle *pfStack_1890;
  undefined1 auStack_1884 [12];
  kvs_ops_stat *pkStack_1878;
  atomic<unsigned_long> aStack_1870;
  timeval tStack_1840;
  __atomic_base<unsigned_long> _Stack_1830;
  kvs_ops_stat *pkStack_1828;
  __atomic_base<unsigned_long> _Stack_1820;
  fdb_kvs_info fStack_1810;
  undefined1 uStack_17c0;
  undefined1 uStack_17b2;
  btree *pbStack_17a8;
  code *pcStack_1788;
  uint8_t auStack_1780 [8];
  filemgr_ops *pfStack_1778;
  fdb_kvs_handle *pfStack_16e8;
  fdb_kvs_handle *pfStack_16e0;
  fdb_kvs_handle *pfStack_16d8;
  fdb_txn *pfStack_16d0;
  fdb_kvs_handle *pfStack_16c8;
  fdb_kvs_handle *pfStack_16c0;
  fdb_file_handle *pfStack_16b0;
  uint uStack_16a4;
  fdb_kvs_handle *pfStack_16a0;
  fdb_kvs_handle *pfStack_1698;
  undefined1 auStack_1690 [48];
  atomic<unsigned_long> aStack_1660;
  undefined1 auStack_1658 [32];
  fdb_kvs_info fStack_1638;
  timeval tStack_1608;
  undefined1 auStack_15f8 [160];
  char acStack_1558 [256];
  char acStack_1458 [256];
  fdb_kvs_handle fStack_1358;
  fdb_kvs_handle *pfStack_1150;
  fdb_kvs_config *pfStack_1148;
  fdb_doc *pfStack_1140;
  code *pcStack_1138;
  undefined1 auStack_1120 [36];
  undefined4 uStack_10fc;
  fdb_kvs_handle *pfStack_10f8;
  fdb_doc **ppfStack_10f0;
  timeval tStack_10e8;
  fdb_kvs_config fStack_10d8;
  fdb_doc afStack_10c0 [3];
  char acStack_fc0 [256];
  char acStack_ec0 [264];
  fdb_config fStack_db8;
  fdb_doc *pfStack_cc0;
  size_t *psStack_cb8;
  fdb_doc afStack_810 [15];
  fdb_kvs_handle *pfStack_358;
  fdb_kvs_handle *pfStack_350;
  fdb_kvs_handle *pfStack_348;
  char *pcStack_340;
  btree **ppbStack_338;
  code *pcStack_330;
  fdb_kvs_handle *local_320;
  int local_314;
  fdb_kvs_handle *local_310;
  undefined1 local_308 [40];
  hbtrie *local_2e0;
  btree *local_2d8 [2];
  filemgr *local_2c8 [2];
  char local_2b8 [64];
  char local_278 [64];
  undefined1 local_238 [112];
  fdb_doc *local_1c8;
  snap_handle *local_120;
  uint64_t local_118;
  undefined4 local_104;
  undefined1 local_f9;
  undefined1 local_e8;
  
  pcStack_330 = (code *)0x11a36d;
  gettimeofday((timeval *)(local_238 + 0x60),(__timezone_ptr_t)0x0);
  pcStack_330 = (code *)0x11a379;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_330 = (code *)0x11a389;
  fdb_get_default_config();
  pcStack_330 = (code *)0x11a396;
  fdb_get_default_kvs_config();
  local_120 = (snap_handle *)0x0;
  local_118 = 0x400;
  local_104 = 1;
  local_f9 = 0;
  pcStack_330 = (code *)0x11a3c9;
  local_e8 = multi_kv;
  fdb_open((fdb_file_handle **)&local_320,"./mvcc_test1",(fdb_config *)&stack0xfffffffffffffed8);
  local_314 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_314 == 0) {
    pcStack_330 = (code *)0x11a43e;
    fdb_kvs_open_default
              ((fdb_file_handle *)local_320,(fdb_kvs_handle **)local_308,(fdb_kvs_config *)local_238
              );
    pcVar14 = (char *)0x1;
  }
  else {
    ppfVar11 = (fdb_kvs_handle **)local_308;
    unaff_R12 = (fdb_kvs_handle *)local_238;
    uVar21 = 0;
    do {
      pcStack_330 = (code *)0x11a400;
      sprintf(local_238 + 0x18,"kv%d",uVar21 & 0xffffffff);
      pcStack_330 = (code *)0x11a413;
      fdb_kvs_open((fdb_file_handle *)local_320,ppfVar11,local_238 + 0x18,
                   (fdb_kvs_config *)unaff_R12);
      uVar21 = uVar21 + 1;
      ppfVar11 = ppfVar11 + 1;
    } while (uVar21 != 4);
    pcVar14 = (char *)0x4;
    unaff_R13 = (fdb_kvs_handle *)0x4;
  }
  __s_01 = (btree **)0x0;
  pcVar8 = logCallbackFunc;
  pcVar23 = "rollback_to_zero_after_compact_test";
  do {
    pfVar15 = *(fdb_kvs_handle **)(local_308 + (long)__s_01 * 8);
    pcStack_330 = (code *)0x11a464;
    fVar2 = fdb_set_log_callback(pfVar15,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_330 = (code *)0x11a977;
      rollback_to_zero_after_compact_test();
      goto LAB_0011a977;
    }
    __s_01 = (btree **)((long)__s_01 + 1);
  } while ((btree **)pcVar14 != __s_01);
  uVar21 = 0;
  do {
    pcStack_330 = (code *)0x11a493;
    sprintf(local_278,"key%d",uVar21 & 0xffffffff);
    pcStack_330 = (code *)0x11a4a9;
    sprintf(local_2b8,"meta%d",uVar21 & 0xffffffff);
    pcStack_330 = (code *)0x11a4c2;
    sprintf(local_238 + 0x20,"body%d",uVar21 & 0xffffffff);
    pcStack_330 = (code *)0x11a4d5;
    sVar5 = strlen(local_278);
    pcStack_330 = (code *)0x11a4e5;
    sVar6 = strlen(local_2b8);
    pcStack_330 = (code *)0x11a4f5;
    sVar7 = strlen(local_238 + 0x20);
    pcStack_330 = (code *)0x11a51a;
    fdb_doc_create((fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar21 * 8),local_278,sVar5,
                   local_2b8,sVar6,local_238 + 0x20,sVar7);
    lVar9 = 0;
    do {
      pcStack_330 = (code *)0x11a52b;
      fdb_set(*(fdb_kvs_handle **)(local_308 + lVar9 * 8),
              *(fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar21 * 8));
      lVar9 = lVar9 + 1;
    } while (pcVar14 != (char *)lVar9);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 5);
  pcStack_330 = (code *)0x11a54f;
  fdb_commit((fdb_file_handle *)local_320,'\x01');
  uVar21 = 5;
  do {
    pcStack_330 = (code *)0x11a571;
    sprintf(local_278,"key%d",uVar21 & 0xffffffff);
    pcStack_330 = (code *)0x11a58a;
    sprintf(local_2b8,"meta%d",uVar21 & 0xffffffff);
    pcVar23 = local_238 + 0x20;
    pcStack_330 = (code *)0x11a5a6;
    sprintf(pcVar23,"body%d",uVar21 & 0xffffffff);
    pcStack_330 = (code *)0x11a5b9;
    sVar5 = strlen(local_278);
    pcStack_330 = (code *)0x11a5c4;
    sVar6 = strlen(local_2b8);
    pcStack_330 = (code *)0x11a5cf;
    sVar7 = strlen(pcVar23);
    pcStack_330 = (code *)0x11a5f1;
    fdb_doc_create((fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar21 * 8),local_278,sVar5,
                   local_2b8,sVar6,pcVar23,sVar7);
    lVar9 = 0;
    do {
      pcStack_330 = (code *)0x11a601;
      fdb_set(*(fdb_kvs_handle **)(local_308 + lVar9 * 8),
              *(fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar21 * 8));
      lVar9 = lVar9 + 1;
    } while (pcVar14 != (char *)lVar9);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 10);
  pcStack_330 = (code *)0x11a622;
  fdb_commit((fdb_file_handle *)local_320,'\0');
  uVar21 = 10;
  do {
    pcStack_330 = (code *)0x11a644;
    sprintf(local_278,"key%d",uVar21 & 0xffffffff);
    pcStack_330 = (code *)0x11a65d;
    sprintf(local_2b8,"meta%d",uVar21 & 0xffffffff);
    pcVar23 = local_238 + 0x20;
    pcStack_330 = (code *)0x11a679;
    sprintf(pcVar23,"body%d",uVar21 & 0xffffffff);
    pcStack_330 = (code *)0x11a68c;
    sVar5 = strlen(local_278);
    pcStack_330 = (code *)0x11a697;
    sVar6 = strlen(local_2b8);
    pcStack_330 = (code *)0x11a6a2;
    sVar7 = strlen(pcVar23);
    pcStack_330 = (code *)0x11a6c4;
    fdb_doc_create((fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar21 * 8),local_278,sVar5,
                   local_2b8,sVar6,pcVar23,sVar7);
    lVar9 = 0;
    do {
      pcStack_330 = (code *)0x11a6d4;
      fdb_set(*(fdb_kvs_handle **)(local_308 + lVar9 * 8),
              *(fdb_doc **)((long)&stack0xfffffffffffffe38 + uVar21 * 8));
      lVar9 = lVar9 + 1;
    } while (pcVar14 != (char *)lVar9);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0xf);
  pcStack_330 = (code *)0x11a6f8;
  fdb_commit((fdb_file_handle *)local_320,'\x01');
  uVar21 = 0xf;
  do {
    pcStack_330 = (code *)0x11a71a;
    sprintf(local_278,"key%d",uVar21 & 0xffffffff);
    pcStack_330 = (code *)0x11a733;
    sprintf(local_2b8,"meta%d",uVar21 & 0xffffffff);
    __s_01 = (btree **)(local_238 + 0x20);
    pcStack_330 = (code *)0x11a74f;
    sprintf((char *)__s_01,"body%d",uVar21 & 0xffffffff);
    unaff_R13 = (fdb_kvs_handle *)((long)&stack0xfffffffffffffe38 + uVar21 * 8);
    pcStack_330 = (code *)0x11a762;
    sVar5 = strlen(local_278);
    pcStack_330 = (code *)0x11a76d;
    unaff_R12 = (fdb_kvs_handle *)strlen(local_2b8);
    pcStack_330 = (code *)0x11a778;
    sVar6 = strlen((char *)__s_01);
    pcStack_330 = (code *)0x11a79a;
    fdb_doc_create((fdb_doc **)unaff_R13,local_278,sVar5,local_2b8,(size_t)unaff_R12,__s_01,sVar6);
    pcVar8 = (code *)0x0;
    do {
      pcStack_330 = (code *)0x11a7aa;
      fdb_set(*(fdb_kvs_handle **)(local_308 + (long)pcVar8 * 8),*(fdb_doc **)&unaff_R13->kvs_config
             );
      pcVar8 = (code *)((long)pcVar8 + 1);
    } while ((code *)pcVar14 != pcVar8);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0x14);
  pcStack_330 = (code *)0x11a7cb;
  fdb_commit((fdb_file_handle *)local_320,'\0');
  pfVar15 = (fdb_kvs_handle *)&local_310;
  pcStack_330 = (code *)0x11a7e4;
  fVar2 = fdb_open((fdb_file_handle **)pfVar15,"./mvcc_test1",(fdb_config *)&stack0xfffffffffffffed8
                  );
  pcVar23 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a98b;
  pcStack_330 = (code *)0x11a7fd;
  pfVar15 = local_310;
  fVar2 = fdb_compact((fdb_file_handle *)local_310,"./mvcc_test2");
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a990;
  pcStack_330 = (code *)0x11a80f;
  fdb_close((fdb_file_handle *)local_310);
  __s_01 = local_2d8;
  unaff_R12 = (fdb_kvs_handle *)local_2c8;
  pcVar14 = (char *)(ulong)(uint)((int)pcVar14 << 3);
  pcVar23 = (char *)0x0;
  unaff_R13 = (fdb_kvs_handle *)(local_308 + 0x20);
  do {
    pcVar8 = (code *)(local_308 + (long)pcVar23);
    pcStack_330 = (code *)0x11a836;
    pfVar15 = (fdb_kvs_handle *)pcVar8;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar8,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a97c;
    pfVar15 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar8)->kvs_config;
    pcStack_330 = (code *)0x11a849;
    fVar2 = fdb_get_kvs_info(pfVar15,(fdb_kvs_info *)unaff_R13);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a977;
    if (local_2e0 != (hbtrie *)0x0) {
      pcStack_330 = (code *)0x11a8af;
      rollback_to_zero_after_compact_test();
    }
    if (local_2d8[0] != (btree *)0x0) {
      pcStack_330 = (code *)0x11a8b9;
      rollback_to_zero_after_compact_test();
    }
    if (local_2c8[0] != (filemgr *)0x0) {
      pcStack_330 = (code *)0x11a8c3;
      rollback_to_zero_after_compact_test();
    }
    pfVar15 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar8)->kvs_config;
    pcStack_330 = (code *)0x11a879;
    fVar2 = fdb_get(pfVar15,local_1c8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a986;
    pfVar15 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar8)->kvs_config;
    pcStack_330 = (code *)0x11a892;
    fVar2 = fdb_set(pfVar15,local_1c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a981;
    pcVar23 = pcVar23 + 8;
  } while (pcVar14 != pcVar23);
  pcStack_330 = (code *)0x11a8d4;
  pfVar15 = local_320;
  fVar2 = fdb_commit((fdb_file_handle *)local_320,'\x01');
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_330 = (code *)0x11a8e6;
    fdb_close((fdb_file_handle *)local_320);
    lVar9 = 0;
    do {
      pcStack_330 = (code *)0x11a8f5;
      fdb_doc_free(*(fdb_doc **)((long)&stack0xfffffffffffffe38 + lVar9 * 8));
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x14);
    pcStack_330 = (code *)0x11a903;
    fdb_shutdown();
    pcVar14 = "single kv mode:";
    if ((char)local_314 != '\0') {
      pcVar14 = "multiple kv mode:";
    }
    pcStack_330 = (code *)0x11a933;
    sprintf(local_238 + 0x20,"rollback to zero after compact test %s",pcVar14);
    pcVar14 = "%s PASSED\n";
    if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
      pcVar14 = "%s FAILED\n";
    }
    pcStack_330 = (code *)0x11a960;
    fprintf(_stderr,pcVar14,local_238 + 0x20);
    return;
  }
  goto LAB_0011a995;
LAB_0011b672:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b677;
  rollback_all_test();
LAB_0011b677:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b67c;
  rollback_all_test();
LAB_0011b67c:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b684;
  rollback_all_test();
  pfVar26 = (fdb_kvs_handle *)pcVar8;
LAB_0011b684:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b689;
  rollback_all_test();
LAB_0011b689:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b68e;
  rollback_all_test();
LAB_0011b68e:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b693;
  rollback_all_test();
LAB_0011b693:
  pfStack_16c0 = (fdb_kvs_handle *)0x11b698;
  rollback_all_test();
  goto LAB_0011b698;
LAB_0011be65:
  pfStack_1b68 = (fdb_kvs_handle *)0x11be6a;
  rollback_during_ops_test();
LAB_0011be6a:
  pfStack_1b68 = (fdb_kvs_handle *)0x11be6f;
  rollback_during_ops_test();
  goto LAB_0011be6f;
LAB_0011c266:
  pfStack_1d20 = (fdb_kvs_handle *)0x11c26b;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c26b;
LAB_0011c67b:
  pcStack_41d8 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_41d8 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_41d8 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_41d8 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_41d8 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_41d8 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_41d8 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_46e0 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_48b8 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_48b8 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011a977:
  pcStack_330 = (code *)0x11a97c;
  rollback_to_zero_after_compact_test();
LAB_0011a97c:
  pcStack_330 = (code *)0x11a981;
  rollback_to_zero_after_compact_test();
LAB_0011a981:
  pcStack_330 = (code *)0x11a986;
  rollback_to_zero_after_compact_test();
LAB_0011a986:
  pcStack_330 = (code *)0x11a98b;
  rollback_to_zero_after_compact_test();
LAB_0011a98b:
  pcStack_330 = (code *)0x11a990;
  rollback_to_zero_after_compact_test();
LAB_0011a990:
  pcStack_330 = (code *)0x11a995;
  rollback_to_zero_after_compact_test();
LAB_0011a995:
  pcStack_330 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s = (char *)((ulong)pfVar15 & 0xffffffff);
  pcStack_1138 = (code *)0x11a9b9;
  pfStack_358 = (fdb_kvs_handle *)pcVar8;
  pfStack_350 = unaff_R12;
  pfStack_348 = unaff_R13;
  pcStack_340 = pcVar23;
  ppbStack_338 = __s_01;
  pcStack_330 = (code *)pcVar14;
  gettimeofday(&tStack_10e8,(__timezone_ptr_t)0x0);
  pcStack_1138 = (code *)0x11a9be;
  memleak_start();
  pcStack_1138 = (code *)0x11a9ca;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_1138 = (code *)0x11a9da;
  fdb_get_default_config();
  config = &fStack_10d8;
  pcStack_1138 = (code *)0x11a9e7;
  fdb_get_default_kvs_config();
  fStack_db8.buffercache_size = 0;
  fStack_db8.wal_threshold = 0x100;
  fStack_db8.flags = 1;
  fStack_db8.compaction_threshold = '\0';
  uStack_10fc = SUB84(pfVar15,0);
  fStack_db8.multi_kv_instances = SUB81(__s,0);
  doc_01 = (fdb_doc *)(auStack_1120 + 0x18);
  pcStack_1138 = (code *)0x11aa21;
  fdb_open((fdb_file_handle **)doc_01,"./mvcc_test8",&fStack_db8);
  ptr_handle = (fdb_doc *)auStack_1120;
  pcStack_1138 = (code *)0x11aa34;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1120._24_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_1138 = (code *)0x11aa4a;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1120._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar9 = 0;
    uVar21 = 0;
    do {
      pcStack_1138 = (code *)0x11aa74;
      sprintf(acStack_fc0,"key%d",uVar21 & 0xffffffff);
      pcStack_1138 = (code *)0x11aa8d;
      sprintf(acStack_ec0,"meta%d",uVar21 & 0xffffffff);
      pcStack_1138 = (code *)0x11aaa3;
      sprintf((char *)afStack_10c0,"body%d",uVar21 & 0xffffffff);
      pcStack_1138 = (code *)0x11aab6;
      sVar5 = strlen(acStack_fc0);
      pcStack_1138 = (code *)0x11aac9;
      sVar6 = strlen(acStack_ec0);
      pcStack_1138 = (code *)0x11aad6;
      sVar7 = strlen((char *)afStack_10c0);
      pcStack_1138 = (code *)0x11aaf8;
      fdb_doc_create((fdb_doc **)((long)&pfStack_cc0 + lVar9),acStack_fc0,sVar5,acStack_ec0,sVar6,
                     afStack_10c0,sVar7);
      pcStack_1138 = (code *)0x11ab0a;
      fdb_set((fdb_kvs_handle *)auStack_1120._0_8_,(&pfStack_cc0)[uVar21]);
      uVar21 = uVar21 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar21 != 300);
    pcStack_1138 = (code *)0x11ab2a;
    fdb_commit((fdb_file_handle *)auStack_1120._24_8_,'\0');
    lVar9 = 0;
    uVar21 = 0;
    do {
      ppfStack_10f0 = (fdb_doc **)((long)&pfStack_cc0 + lVar9);
      pcStack_1138 = (code *)0x11ab4c;
      fdb_doc_free((&pfStack_cc0)[uVar21]);
      pcStack_1138 = (code *)0x11ab68;
      sprintf(acStack_fc0,"key%d",uVar21 & 0xffffffff);
      pcStack_1138 = (code *)0x11ab84;
      sprintf(acStack_ec0,"META%d",uVar21 & 0xffffffff);
      pcStack_1138 = (code *)0x11ab9d;
      sprintf((char *)afStack_10c0,"BODY%d",uVar21 & 0xffffffff);
      pcStack_1138 = (code *)0x11aba5;
      sVar5 = strlen(acStack_fc0);
      pcStack_1138 = (code *)0x11abb0;
      sVar6 = strlen(acStack_ec0);
      pcStack_1138 = (code *)0x11abbb;
      sVar7 = strlen((char *)afStack_10c0);
      pcStack_1138 = (code *)0x11abdd;
      fdb_doc_create(ppfStack_10f0,acStack_fc0,sVar5,acStack_ec0,sVar6,afStack_10c0,sVar7);
      pcStack_1138 = (code *)0x11abef;
      fdb_set((fdb_kvs_handle *)auStack_1120._0_8_,(&pfStack_cc0)[uVar21]);
      uVar21 = uVar21 + 1;
      lVar9 = lVar9 + 8;
    } while (uVar21 != 0x96);
    pcStack_1138 = (code *)0x11ac0f;
    fdb_commit((fdb_file_handle *)auStack_1120._24_8_,'\0');
    uVar21 = 0x96;
    doc_01 = afStack_810;
    do {
      pcStack_1138 = (code *)0x11ac25;
      fdb_doc_free((fdb_doc *)doc_01->keylen);
      pcStack_1138 = (code *)0x11ac41;
      sprintf(acStack_fc0,"key%d",uVar21 & 0xffffffff);
      __s = acStack_ec0;
      pcStack_1138 = (code *)0x11ac5d;
      sprintf(__s,"Meta%d",uVar21 & 0xffffffff);
      ptr_handle = afStack_10c0;
      pcStack_1138 = (code *)0x11ac76;
      sprintf((char *)ptr_handle,"Body%d",uVar21 & 0xffffffff);
      pcStack_1138 = (code *)0x11ac7e;
      unaff_R12 = (fdb_kvs_handle *)strlen(acStack_fc0);
      pcStack_1138 = (code *)0x11ac89;
      unaff_R13 = (fdb_kvs_handle *)strlen(__s);
      pcStack_1138 = (code *)0x11ac94;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_1138 = (code *)0x11acb4;
      fdb_doc_create((fdb_doc **)doc_01,acStack_fc0,(size_t)unaff_R12,__s,(size_t)unaff_R13,
                     ptr_handle,sVar5);
      pcStack_1138 = (code *)0x11acc1;
      fdb_set((fdb_kvs_handle *)auStack_1120._0_8_,(fdb_doc *)doc_01->keylen);
      uVar21 = uVar21 + 1;
      doc_01 = (fdb_doc *)&doc_01->metalen;
    } while (uVar21 != 300);
    pcStack_1138 = (code *)0x11ace1;
    fdb_commit((fdb_file_handle *)auStack_1120._24_8_,'\0');
    pcStack_1138 = (code *)0x11acf0;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_1120,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae48;
    pcStack_1138 = (code *)0x11ad21;
    fdb_doc_create((fdb_doc **)(auStack_1120 + 0x10),(void *)psStack_cb8[4],*psStack_cb8,(void *)0x0
                   ,0,(void *)0x0,0);
    pcStack_1138 = (code *)0x11ad35;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1120._0_8_,&pfStack_10f8,0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae4d;
    pcStack_1138 = (code *)0x11ad4c;
    fVar2 = fdb_get(pfStack_10f8,(fdb_doc *)auStack_1120._16_8_);
    pfVar25 = (fdb_doc *)auStack_1120._16_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ae52;
    ptr_handle = *(fdb_doc **)(auStack_1120._16_8_ + 0x40);
    config = (fdb_kvs_config *)psStack_cb8[8];
    pcStack_1138 = (code *)0x11ad78;
    iVar3 = bcmp(ptr_handle,config,*(size_t *)(auStack_1120._16_8_ + 0x10));
    if (iVar3 == 0) {
      if (*(uint64_t *)((long)pfVar25 + 0x28) != 0x12e) {
        pcStack_1138 = (code *)0x11ad94;
        rollback_to_wal_test();
      }
      pcStack_1138 = (code *)0x11ad9e;
      fdb_doc_free((fdb_doc *)auStack_1120._16_8_);
      pcStack_1138 = (code *)0x11ada8;
      fdb_kvs_close(pfStack_10f8);
      pcStack_1138 = (code *)0x11adb2;
      fdb_close((fdb_file_handle *)auStack_1120._24_8_);
      lVar9 = 0;
      do {
        pcStack_1138 = (code *)0x11adc1;
        fdb_doc_free((&pfStack_cc0)[lVar9]);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 300);
      pcStack_1138 = (code *)0x11add2;
      fdb_shutdown();
      pcStack_1138 = (code *)0x11add7;
      memleak_end();
      pcVar14 = "single kv mode:";
      if ((char)uStack_10fc != '\0') {
        pcVar14 = "multiple kv mode:";
      }
      pcStack_1138 = (code *)0x11ae04;
      sprintf((char *)afStack_10c0,"rollback to wal test %s",pcVar14);
      pcVar14 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pcStack_1138 = (code *)0x11ae31;
      fprintf(_stderr,pcVar14,afStack_10c0);
      return;
    }
  }
  else {
    pcStack_1138 = (code *)0x11ae48;
    rollback_to_wal_test();
LAB_0011ae48:
    pcStack_1138 = (code *)0x11ae4d;
    rollback_to_wal_test();
LAB_0011ae4d:
    pcStack_1138 = (code *)0x11ae52;
    rollback_to_wal_test();
LAB_0011ae52:
    pfVar25 = doc_01;
    pcStack_1138 = (code *)0x11ae57;
    rollback_to_wal_test();
  }
  pcStack_1138 = rollback_all_test;
  pfVar19 = config;
  rollback_to_wal_test();
  pfStack_16c0 = (fdb_kvs_handle *)0x11ae87;
  fStack_1358.bub_ctx.space_used = (uint64_t)ptr_handle;
  fStack_1358.bub_ctx.handle = unaff_R12;
  pfStack_1150 = unaff_R13;
  pfStack_1148 = config;
  pfStack_1140 = pfVar25;
  pcStack_1138 = (code *)__s;
  gettimeofday(&tStack_1608,(__timezone_ptr_t)0x0);
  pfStack_16c0 = (fdb_kvs_handle *)0x11ae8c;
  memleak_start();
  pfStack_16c0 = (fdb_kvs_handle *)0x11ae98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_16c0 = (fdb_kvs_handle *)0x11aea8;
  fdb_get_default_config();
  pfStack_16c0 = (fdb_kvs_handle *)0x11aeb2;
  fdb_get_default_kvs_config();
  fStack_1358.config.encryption_key.bytes[4] = '\0';
  fStack_1358.config.encryption_key.bytes[5] = '\0';
  fStack_1358.config.encryption_key.bytes[6] = '\0';
  fStack_1358.config.encryption_key.bytes[7] = '\0';
  fStack_1358.config.encryption_key.bytes[8] = '\0';
  fStack_1358.config.encryption_key.bytes[9] = '\0';
  fStack_1358.config.encryption_key.bytes[10] = '\0';
  fStack_1358.config.encryption_key.bytes[0xb] = '\0';
  fStack_1358.config.encryption_key.bytes[0xc] = '\0';
  fStack_1358.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1358.config.encryption_key.bytes[0xe] = '\0';
  fStack_1358.config.encryption_key.bytes[0xf] = '\0';
  fStack_1358.config.encryption_key.bytes[0x10] = '\0';
  fStack_1358.config.encryption_key.bytes[0x11] = '\0';
  fStack_1358.config.encryption_key.bytes[0x12] = '\0';
  fStack_1358.config.encryption_key.bytes[0x13] = '\0';
  fStack_1358.config._180_4_ = 1;
  fStack_1358.config.block_reusing_threshold._7_1_ = 0;
  fStack_1358.max_seqnum = 0;
  pfStack_16c0 = (fdb_kvs_handle *)0x11aee8;
  fStack_1358.config.num_keeping_headers._0_1_ = (char)pfVar19;
  fdb_open(&pfStack_16b0,"./mvcc_test6",(fdb_config *)&fStack_1358.config.encryption_key);
  uStack_16a4 = (uint)pfVar19;
  if (uStack_16a4 == 0) {
    pfStack_16c0 = (fdb_kvs_handle *)0x11af54;
    fdb_kvs_open_default
              (pfStack_16b0,(fdb_kvs_handle **)(auStack_1690 + 8),
               (fdb_kvs_config *)(auStack_1658 + 8));
    pfVar15 = (fdb_kvs_handle *)0x1;
  }
  else {
    ppfVar11 = (fdb_kvs_handle **)(auStack_1690 + 8);
    unaff_R12 = (fdb_kvs_handle *)(auStack_1658 + 8);
    uVar21 = 0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11af19;
      sprintf(auStack_1658,"kv%d",uVar21 & 0xffffffff);
      pfStack_16c0 = (fdb_kvs_handle *)0x11af2c;
      fdb_kvs_open(pfStack_16b0,ppfVar11,auStack_1658,(fdb_kvs_config *)unaff_R12);
      uVar21 = uVar21 + 1;
      ppfVar11 = ppfVar11 + 1;
    } while (uVar21 != 4);
    pfVar15 = (fdb_kvs_handle *)0x4;
    unaff_R13 = (fdb_kvs_handle *)0x4;
  }
  pcVar23 = (char *)0x0;
  pcVar8 = logCallbackFunc;
  pcVar14 = "rollback_all_test";
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11af7a;
    fVar2 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_1690 + (long)pcVar23 * 8 + 8),logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b672;
      rollback_all_test();
      goto LAB_0011b672;
    }
    pcVar23 = (char *)((long)&((fdb_txn *)pcVar23)->handle + 1);
  } while (pfVar15 != (fdb_kvs_handle *)pcVar23);
  uVar21 = 0;
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11afa9;
    sprintf(acStack_1458,"key%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11afc5;
    sprintf(acStack_1558,"meta%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11afe1;
    sprintf((char *)&fStack_1358,"body%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11aff4;
    sVar5 = strlen(acStack_1458);
    pfStack_16c0 = (fdb_kvs_handle *)0x11afff;
    sVar6 = strlen(acStack_1558);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b00a;
    sVar7 = strlen((char *)&fStack_1358);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b02f;
    fdb_doc_create((fdb_doc **)(auStack_15f8 + uVar21 * 8),acStack_1458,sVar5,acStack_1558,sVar6,
                   &fStack_1358,sVar7);
    lVar9 = 0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b03f;
      fdb_set(*(fdb_kvs_handle **)(auStack_1690 + lVar9 * 8 + 8),
              *(fdb_doc **)(auStack_15f8 + uVar21 * 8));
      lVar9 = lVar9 + 1;
    } while (pfVar15 != (fdb_kvs_handle *)lVar9);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 5);
  pfStack_16c0 = (fdb_kvs_handle *)0x11b063;
  fdb_commit(pfStack_16b0,'\x01');
  uVar21 = 5;
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11b085;
    sprintf(acStack_1458,"key%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b0a1;
    sprintf(acStack_1558,"meta%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b0bd;
    sprintf((char *)&fStack_1358,"body%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b0d0;
    sVar5 = strlen(acStack_1458);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b0db;
    sVar6 = strlen(acStack_1558);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b0e6;
    sVar7 = strlen((char *)&fStack_1358);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b10b;
    fdb_doc_create((fdb_doc **)(auStack_15f8 + uVar21 * 8),acStack_1458,sVar5,acStack_1558,sVar6,
                   &fStack_1358,sVar7);
    lVar9 = 0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b11c;
      fdb_set(*(fdb_kvs_handle **)(auStack_1690 + lVar9 * 8 + 8),
              *(fdb_doc **)(auStack_15f8 + uVar21 * 8));
      lVar9 = lVar9 + 1;
    } while (pfVar15 != (fdb_kvs_handle *)lVar9);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 10);
  pfStack_16c0 = (fdb_kvs_handle *)0x11b13d;
  fdb_commit(pfStack_16b0,'\0');
  uVar21 = 10;
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11b15f;
    sprintf(acStack_1458,"key%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b17b;
    sprintf(acStack_1558,"meta%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b197;
    sprintf((char *)&fStack_1358,"body%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b1aa;
    sVar5 = strlen(acStack_1458);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b1b5;
    sVar6 = strlen(acStack_1558);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b1c0;
    sVar7 = strlen((char *)&fStack_1358);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b1e5;
    fdb_doc_create((fdb_doc **)(auStack_15f8 + uVar21 * 8),acStack_1458,sVar5,acStack_1558,sVar6,
                   &fStack_1358,sVar7);
    lVar9 = 0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b1f6;
      fdb_set(*(fdb_kvs_handle **)(auStack_1690 + lVar9 * 8 + 8),
              *(fdb_doc **)(auStack_15f8 + uVar21 * 8));
      lVar9 = lVar9 + 1;
    } while (pfVar15 != (fdb_kvs_handle *)lVar9);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0xf);
  pfStack_16c0 = (fdb_kvs_handle *)0x11b21a;
  fdb_commit(pfStack_16b0,'\x01');
  uVar21 = 0xf;
  do {
    pfStack_16c0 = (fdb_kvs_handle *)0x11b23c;
    sprintf(acStack_1458,"key%d",uVar21 & 0xffffffff);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b258;
    sprintf(acStack_1558,"meta%d",uVar21 & 0xffffffff);
    pfVar26 = &fStack_1358;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b274;
    sprintf((char *)pfVar26,"body%d",uVar21 & 0xffffffff);
    unaff_R12 = (fdb_kvs_handle *)(auStack_15f8 + uVar21 * 8);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b287;
    sVar5 = strlen(acStack_1458);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b292;
    unaff_R13 = (fdb_kvs_handle *)strlen(acStack_1558);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b29d;
    sVar6 = strlen((char *)pfVar26);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b2c2;
    fdb_doc_create((fdb_doc **)unaff_R12,acStack_1458,sVar5,acStack_1558,(size_t)unaff_R13,pfVar26,
                   sVar6);
    pcVar23 = (char *)0x0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b2d3;
      fdb_set(*(fdb_kvs_handle **)(auStack_1690 + (long)pcVar23 * 8 + 8),
              *(fdb_doc **)&unaff_R12->kvs_config);
      pcVar23 = (char *)((long)pcVar23 + 1);
    } while (pfVar15 != (fdb_kvs_handle *)pcVar23);
    uVar21 = uVar21 + 1;
  } while (uVar21 != 0x14);
  pfStack_16c0 = (fdb_kvs_handle *)0x11b2f4;
  fdb_commit(pfStack_16b0,'\0');
  pfStack_16c0 = (fdb_kvs_handle *)0x11b308;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_16b0,(fdb_snapshot_info_t **)&pfStack_1698,(uint64_t *)&pfStack_16a0);
  pcVar14 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar23 = (char *)(ulong)uStack_16a4;
    cVar22 = (char)uStack_16a4;
    if (cVar22 == '\0') {
      if (pfStack_16a0 != (fdb_kvs_handle *)0x4) {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b341;
        rollback_all_test();
      }
    }
    else if (pfStack_16a0 != (fdb_kvs_handle *)0x8) {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b32f;
      rollback_all_test();
    }
    pfStack_16c0 = (fdb_kvs_handle *)0x11b354;
    fVar2 = fdb_rollback_all(pfStack_16b0,(fdb_snapshot_marker_t)pfStack_1698->kvs);
    if (cVar22 == '\0') {
LAB_0011b41a:
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b69d;
      unaff_R13 = (fdb_kvs_handle *)(auStack_1690 + 8);
      if (cVar22 != '\0') {
        pcVar14 = auStack_1658;
        pcVar23 = "rollback_all_test";
        pfVar26 = (fdb_kvs_handle *)0x0;
        unaff_R12 = pfVar15;
        do {
          pfStack_16c0 = (fdb_kvs_handle *)0x11b450;
          sprintf(pcVar14,"kv%d",pfVar26);
          pfStack_16c0 = (fdb_kvs_handle *)0x11b465;
          fVar2 = fdb_kvs_open(pfStack_16b0,(fdb_kvs_handle **)unaff_R13,pcVar14,
                               (fdb_kvs_config *)(auStack_1658 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b693;
          pfStack_16c0 = (fdb_kvs_handle *)0x11b480;
          fVar2 = fdb_set_log_callback
                            (*(fdb_kvs_handle **)&unaff_R13->kvs_config,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b68e;
          pfVar26 = (fdb_kvs_handle *)(ulong)((int)pfVar26 + 1);
          unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).custom_cmp;
          unaff_R12 = (fdb_kvs_handle *)((long)&unaff_R12[-1].bub_ctx.handle + 7);
        } while (unaff_R12 != (fdb_kvs_handle *)0x0);
      }
      unaff_R12 = (fdb_kvs_handle *)0x0;
      unaff_R13 = (fdb_kvs_handle *)auStack_1690;
      pcVar14 = (char *)&aStack_1660;
      do {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b4b2;
        fVar2 = fdb_get_kvs_info(*(fdb_kvs_handle **)(auStack_1690 + (long)unaff_R12 * 8 + 8),
                                 &fStack_1638);
        pcVar8 = (code *)pfVar26;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b677;
        if ((hbtrie *)fStack_1638.last_seqnum != (hbtrie *)0xf) {
          pfStack_16c0 = (fdb_kvs_handle *)0x11b566;
          rollback_all_test();
        }
        if ((filemgr_ops *)fStack_1638.doc_count != (filemgr_ops *)0xf) {
          pfStack_16c0 = (fdb_kvs_handle *)0x11b578;
          rollback_all_test();
        }
        pfStack_16c0 = (fdb_kvs_handle *)0x11b4ea;
        fVar2 = fdb_get(*(fdb_kvs_handle **)(auStack_1690 + (long)unaff_R12 * 8 + 8),
                        (fdb_doc *)auStack_15f8._152_8_);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b672;
        pfStack_16c0 = (fdb_kvs_handle *)0x11b512;
        fVar2 = fdb_get_kv(*(fdb_kvs_handle **)(auStack_1690 + (long)unaff_R12 * 8 + 8),
                           *(_func_cs_off_t_int **)(auStack_15f8._0_8_ + 0x20),
                           (size_t)*(_func_int_char_ptr_int_mode_t **)auStack_15f8._0_8_,
                           (void **)unaff_R13,(size_t *)pcVar14);
        pcVar8 = (code *)auStack_1690._0_8_;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b684;
        pcVar23 = *(char **)(auStack_15f8._0_8_ + 0x40);
        pfStack_16c0 = (fdb_kvs_handle *)0x11b53b;
        iVar3 = bcmp(pcVar23,(void *)auStack_1690._0_8_,
                     (size_t)aStack_1660.super___atomic_base<unsigned_long>._M_i);
        if (iVar3 != 0) goto LAB_0011b67c;
        pfStack_16c0 = (fdb_kvs_handle *)0x11b54b;
        free(pcVar8);
        uVar13 = uStack_16a4;
        unaff_R12 = (fdb_kvs_handle *)&(unaff_R12->kvs_config).field_0x1;
        pfVar26 = (fdb_kvs_handle *)pcVar8;
      } while (pfVar15 != unaff_R12);
      pfVar26 = (fdb_kvs_handle *)0x0;
      pcVar23 = (char *)(ulong)uStack_16a4;
      do {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b596;
        fVar2 = fdb_set(*(fdb_kvs_handle **)(auStack_1690 + (long)pfVar26 * 8 + 8),
                        (fdb_doc *)auStack_15f8._0_8_);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b689;
        pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
      } while (pfVar15 != pfVar26);
      pfStack_16c0 = (fdb_kvs_handle *)0x11b5b5;
      fVar2 = fdb_commit(pfStack_16b0,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6a2;
      pfStack_16c0 = (fdb_kvs_handle *)0x11b5c7;
      fdb_close(pfStack_16b0);
      lVar9 = 0;
      do {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b5d6;
        fdb_doc_free(*(fdb_doc **)(auStack_15f8 + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x14);
      pfStack_16c0 = (fdb_kvs_handle *)0x11b5ee;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_1698,(uint64_t)pfStack_16a0);
      pfVar26 = (fdb_kvs_handle *)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_16c0 = (fdb_kvs_handle *)0x11b5fb;
        fdb_shutdown();
        pfStack_16c0 = (fdb_kvs_handle *)0x11b600;
        memleak_end();
        pcVar14 = "single kv mode:";
        if ((char)uVar13 != '\0') {
          pcVar14 = "multiple kv mode:";
        }
        pfStack_16c0 = (fdb_kvs_handle *)0x11b62e;
        sprintf((char *)&fStack_1358,"rollback all test %s",pcVar14);
        pcVar14 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        pfStack_16c0 = (fdb_kvs_handle *)0x11b65b;
        fprintf(_stderr,pcVar14,&fStack_1358);
        return;
      }
      goto LAB_0011b6a7;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6ac;
    pfVar26 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b372;
      fdb_kvs_close(*(fdb_kvs_handle **)(auStack_1690 + (long)pfVar26 * 8 + 8));
      pfVar26 = (fdb_kvs_handle *)((long)pfVar26 + 1);
    } while (pfVar15 != pfVar26);
    pfStack_16c0 = (fdb_kvs_handle *)0x11b396;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_1638,"./mvcc_test6",
                     (fdb_config *)&fStack_1358.config.encryption_key);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b1;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b3bc;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_1638.name,(fdb_kvs_handle **)auStack_1690,"kv0",
                         (fdb_kvs_config *)(auStack_1658 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6b6;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b3d7;
    fVar2 = fdb_rollback_all(pfStack_16b0,(fdb_snapshot_marker_t)pfStack_1698->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b6bb;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b3ea;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)auStack_1690._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b6c0;
    pfStack_16c0 = (fdb_kvs_handle *)0x11b3ff;
    fVar2 = fdb_close((fdb_file_handle *)fStack_1638.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_16c0 = (fdb_kvs_handle *)0x11b41a;
      fVar2 = fdb_rollback_all(pfStack_16b0,(fdb_snapshot_marker_t)pfStack_1698->kvs);
      goto LAB_0011b41a;
    }
  }
  else {
LAB_0011b698:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b69d;
    rollback_all_test();
LAB_0011b69d:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b6a2;
    rollback_all_test();
LAB_0011b6a2:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b6a7;
    rollback_all_test();
LAB_0011b6a7:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b6ac;
    rollback_all_test();
LAB_0011b6ac:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b6b1;
    rollback_all_test();
LAB_0011b6b1:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b6b6;
    rollback_all_test();
LAB_0011b6b6:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b6bb;
    rollback_all_test();
LAB_0011b6bb:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b6c0;
    rollback_all_test();
LAB_0011b6c0:
    pfStack_16c0 = (fdb_kvs_handle *)0x11b6c5;
    rollback_all_test();
  }
  pfStack_16c0 = (fdb_kvs_handle *)auto_compaction_snapshots_test;
  rollback_all_test();
  pfStack_18b8 = (fdb_kvs_handle *)0x11b6e7;
  pfStack_16e8 = pfVar26;
  pfStack_16e0 = unaff_R12;
  pfStack_16d8 = unaff_R13;
  pfStack_16d0 = (fdb_txn *)pcVar23;
  pfStack_16c8 = (fdb_kvs_handle *)pcVar14;
  pfStack_16c0 = pfVar15;
  gettimeofday(&tStack_1840,(__timezone_ptr_t)0x0);
  pfStack_18b8 = (fdb_kvs_handle *)0x11b6ec;
  memleak_start();
  pfVar24 = (filemgr_ops *)auStack_1884;
  auStack_1884._0_4_ = 0;
  pfStack_18b8 = (fdb_kvs_handle *)0x11b704;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar26 = (fdb_kvs_handle *)&stack0xffffffffffffe820;
  pfStack_18b8 = (fdb_kvs_handle *)0x11b714;
  fdb_get_default_config();
  uStack_17b2 = 1;
  uStack_17c0 = 1;
  pcStack_1788 = compaction_cb_count;
  auStack_1780[0] = ' ';
  auStack_1780[1] = '\0';
  auStack_1780[2] = '\0';
  auStack_1780[3] = '\0';
  pbStack_17a8 = (btree *)0x1;
  pfVar18 = (fdb_kvs_handle *)0x156054;
  pfStack_18b8 = (fdb_kvs_handle *)0x11b74e;
  pfStack_1778 = pfVar24;
  fVar2 = fdb_open(&pfStack_1890,"mvcc_test1",(fdb_config *)pfVar26);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar26 = (fdb_kvs_handle *)(auStack_1884 + 4);
    pfStack_18b8 = (fdb_kvs_handle *)0x11b763;
    fdb_get_default_kvs_config();
    _Stack_1820 = aStack_1870.super___atomic_base<unsigned_long>._M_i;
    _Stack_1830._M_i = auStack_1884._4_8_;
    pkStack_1828 = pkStack_1878;
    pfVar18 = (fdb_kvs_handle *)&pfStack_1898;
    pfStack_18b8 = (fdb_kvs_handle *)0x11b788;
    fVar2 = fdb_kvs_open_default
                      (pfStack_1890,(fdb_kvs_handle **)pfVar18,(fdb_kvs_config *)&_Stack_1830);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba6f;
    unaff_R13 = (fdb_kvs_handle *)0x156958;
    unaff_R12 = (fdb_kvs_handle *)0x0;
    do {
      pcVar14 = (char *)0xcccccccd;
      pfVar16 = (fdb_kvs_handle *)0x1565bd;
      pfVar18 = (fdb_kvs_handle *)(auStack_1884 + 4);
      iVar3 = (int)unaff_R12;
      pfStack_18b8 = (fdb_kvs_handle *)0x11b7bc;
      sprintf((char *)pfVar18,"%d",unaff_R12);
      pfVar15 = pfStack_1898;
      pfStack_18b8 = (fdb_kvs_handle *)0x11b7c9;
      sVar5 = strlen((char *)pfVar18);
      pfStack_18b8 = (fdb_kvs_handle *)0x11b7e0;
      fVar2 = fdb_set_kv(pfVar15,pfVar18,sVar5,"value",5);
      pfVar17 = unaff_R13;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba28;
        auto_compaction_snapshots_test();
LAB_0011ba28:
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba2d;
        auto_compaction_snapshots_test();
LAB_0011ba2d:
        pfVar26 = pfVar15;
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba32;
        auto_compaction_snapshots_test();
LAB_0011ba32:
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba37;
        auto_compaction_snapshots_test();
LAB_0011ba37:
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba3c;
        auto_compaction_snapshots_test();
        unaff_R13 = pfVar17;
        doc_02 = (fdb_kvs_handle *)pcVar14;
LAB_0011ba3c:
        pfVar17 = unaff_R13;
        unaff_R13 = pfVar16;
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba41;
        auto_compaction_snapshots_test();
LAB_0011ba41:
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba4e;
        auto_compaction_snapshots_test();
LAB_0011ba4e:
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba5b;
        pfVar18 = pfVar26;
        auto_compaction_snapshots_test();
LAB_0011ba5b:
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba60;
        auto_compaction_snapshots_test();
        pfVar15 = unaff_R13;
        pcVar14 = (char *)doc_02;
LAB_0011ba60:
        unaff_R13 = pfVar17;
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba65;
        auto_compaction_snapshots_test();
LAB_0011ba65:
        pfVar24 = (filemgr_ops *)(auStack_1884 + 4);
        pfStack_18b8 = (fdb_kvs_handle *)0x11ba6a;
        auto_compaction_snapshots_test();
        goto LAB_0011ba6a;
      }
      pfVar15 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 10) * 10 == iVar3) {
        pfVar18 = (fdb_kvs_handle *)0x0;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b80c;
        fVar2 = fdb_commit(pfStack_1890,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba28;
      }
      pfVar26 = unaff_R12;
      if ((int)((ulong)unaff_R12 / 100) * 100 == iVar3) {
        pfStack_18b8 = (fdb_kvs_handle *)0x11b83d;
        fVar2 = fdb_get_kvs_info(pfStack_1898,&fStack_1810);
        pfVar26 = (fdb_kvs_handle *)fStack_1810.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba2d;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b85f;
        fVar2 = fdb_snapshot_open(pfStack_1898,&pfStack_18a0,fStack_1810.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba37;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b885;
        fdb_doc_create((fdb_doc **)&pfStack_18a8,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_18a8->fhandle = (fdb_file_handle *)pfVar26;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b898;
        fVar2 = fdb_get_byseq(pfStack_18a0,(fdb_doc *)pfStack_18a8);
        pfVar17 = pfStack_18a8;
        doc_02 = (fdb_kvs_handle *)pcVar14;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba3c;
        pcVar14 = (char *)pfStack_18a8->op_stats;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b8b9;
        sVar5 = strlen(auStack_1884 + 4);
        pfStack_18b8 = (fdb_kvs_handle *)0x11b8c7;
        iVar4 = bcmp(pcVar14,auStack_1884 + 4,sVar5);
        doc_02 = (fdb_kvs_handle *)pcVar14;
        if (iVar4 != 0) goto LAB_0011ba41;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b8d7;
        fdb_doc_free((fdb_doc *)pfVar17);
        pfStack_18b8 = (fdb_kvs_handle *)0x11b8e1;
        fVar2 = fdb_kvs_close(pfStack_18a0);
        pfVar16 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba32;
        pfVar18 = (fdb_kvs_handle *)&pfStack_18a0;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b8ff;
        fVar2 = fdb_snapshot_open(pfStack_1898,(fdb_kvs_handle **)pfVar18,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba5b;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b925;
        fdb_doc_create((fdb_doc **)&pfStack_18a8,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        pfStack_18a8->fhandle = (fdb_file_handle *)pfVar26;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b938;
        pfVar18 = pfStack_18a8;
        fVar2 = fdb_get_byseq(pfStack_18a0,(fdb_doc *)pfStack_18a8);
        doc_02 = pfStack_18a8;
        pfVar15 = unaff_R13;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba60;
        pfVar26 = (fdb_kvs_handle *)pfStack_18a8->op_stats;
        pfVar18 = (fdb_kvs_handle *)(auStack_1884 + 4);
        pfStack_18b8 = (fdb_kvs_handle *)0x11b956;
        sVar5 = strlen((char *)pfVar18);
        pfStack_18b8 = (fdb_kvs_handle *)0x11b964;
        iVar4 = bcmp(pfVar26,pfVar18,sVar5);
        if (iVar4 != 0) goto LAB_0011ba4e;
        pfStack_18b8 = (fdb_kvs_handle *)0x11b974;
        fdb_doc_free((fdb_doc *)doc_02);
        pfStack_18b8 = (fdb_kvs_handle *)0x11b97e;
        fVar2 = fdb_kvs_close(pfStack_18a0);
        pcVar14 = (char *)0xcccccccd;
        pfVar15 = (fdb_kvs_handle *)0x1565bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011b996;
        goto LAB_0011ba65;
      }
LAB_0011b996:
      pfVar24 = (filemgr_ops *)(auStack_1884 + 4);
      pcVar14 = (char *)0xcccccccd;
      pfVar15 = (fdb_kvs_handle *)0x1565bd;
      unaff_R12 = (fdb_kvs_handle *)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 100000);
    pfStack_18b8 = (fdb_kvs_handle *)0x11b9b0;
    fVar2 = fdb_close(pfStack_1890);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011ba74;
    pfStack_18b8 = (fdb_kvs_handle *)0x11b9bd;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_18b8 = (fdb_kvs_handle *)0x11b9ca;
      memleak_end();
      pfStack_18b8 = (fdb_kvs_handle *)0x11b9e4;
      sprintf(auStack_1884 + 4,"auto compaction completed %d times with snapshots",
              (ulong)(uint)auStack_1884._0_4_);
      pcVar14 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_18b8 = (fdb_kvs_handle *)0x11ba11;
      fprintf(_stderr,pcVar14,auStack_1884 + 4);
      return;
    }
  }
  else {
LAB_0011ba6a:
    pfStack_18b8 = (fdb_kvs_handle *)0x11ba6f;
    auto_compaction_snapshots_test();
LAB_0011ba6f:
    pfStack_18b8 = (fdb_kvs_handle *)0x11ba74;
    auto_compaction_snapshots_test();
LAB_0011ba74:
    pfStack_18b8 = (fdb_kvs_handle *)0x11ba79;
    auto_compaction_snapshots_test();
  }
  pfStack_18b8 = (fdb_kvs_handle *)compaction_cb_count;
  auto_compaction_snapshots_test();
  pfVar17 = (fdb_kvs_handle *)((ulong)pfVar18 & 0xffffffff);
  __tv = &tStack_18d0;
  pfStack_18e0 = (fdb_kvs_handle *)0x11ba95;
  pfStack_18c0 = pfVar26;
  pfStack_18b8 = pfVar15;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if ((int)pfVar18 == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&pfStack_18a8->kvs_config = *(int *)&pfStack_18a8->kvs_config + 1;
      return;
    }
  }
  else {
    pfStack_18e0 = (fdb_kvs_handle *)0x11bab4;
    compaction_cb_count();
  }
  pfStack_18e0 = (fdb_kvs_handle *)rollback_during_ops_test;
  compaction_cb_count();
  pfStack_1b68 = (fdb_kvs_handle *)0x11bad9;
  pfStack_1900 = unaff_R12;
  pfStack_18f8 = unaff_R13;
  pfStack_18f0 = pfVar24;
  pfStack_18e8 = (fdb_kvs_handle *)pcVar14;
  pfStack_18e0 = pfVar17;
  gettimeofday((timeval *)(auStack_1b37 + 0x2f),(__timezone_ptr_t)0x0);
  pfStack_1b68 = (fdb_kvs_handle *)0x11bade;
  memleak_start();
  iStack_1b54 = 10000;
  if (__tv == (timeval *)0x0) {
    pfStack_1b68 = (fdb_kvs_handle *)0x11bafb;
    system("rm -rf  mvcc_test* > errorlog.txt");
    pfStack_1b68 = (fdb_kvs_handle *)0x11bb08;
    fdb_get_default_config();
    fconfig_01 = &fStack_1a00;
    pfStack_1b68 = (fdb_kvs_handle *)0x11bb20;
    memcpy(fconfig_01,auStack_1af8,0xf8);
    fStack_1a00.block_reusing_threshold = 0;
    pfStack_1b68 = (fdb_kvs_handle *)0x11bb3f;
    fVar2 = fdb_open(&pfStack_1b48,"mvcc_test1",fconfig_01);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_1b68 = (fdb_kvs_handle *)0x11bb54;
      fdb_get_default_kvs_config();
      auStack_1b37._39_8_ = uStack_1ae8;
      auStack_1b37._23_8_ = auStack_1af8._0_8_;
      auStack_1b37._31_8_ = auStack_1af8._8_8_;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bb76;
      fVar2 = fdb_kvs_open_default
                        (pfStack_1b48,&pfStack_1b50,(fdb_kvs_config *)(auStack_1b37 + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bf9d;
      if (0 < iStack_1b54) {
        unaff_R13 = (fdb_kvs_handle *)0x1;
        __tv = (timeval *)CONCAT71((int7)((ulong)auStack_1af8 >> 8),1);
        uVar13 = 0;
        do {
          uVar12 = uVar13 + 1;
          pfVar17 = (fdb_kvs_handle *)(ulong)uVar12;
          pfStack_1b68 = (fdb_kvs_handle *)0x11bbb0;
          sprintf(auStack_1b37,"%d",pfVar17);
          unaff_R12 = pfStack_1b50;
          pfStack_1b68 = (fdb_kvs_handle *)0x11bbbd;
          sVar5 = strlen(auStack_1b37);
          pfStack_1b68 = (fdb_kvs_handle *)0x11bbd8;
          fVar2 = fdb_set_kv(unaff_R12,auStack_1b37,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            pfStack_1b68 = (fdb_kvs_handle *)0x11be65;
            rollback_during_ops_test();
            goto LAB_0011be65;
          }
          ptVar10 = __tv;
          if ((int)((ulong)unaff_R13 / 10) * 10 - 1U == uVar13) {
            ptVar10 = (timeval *)((ulong)__tv & 0xffffffff ^ 1);
            pfStack_1b68 = (fdb_kvs_handle *)0x11bc18;
            fdb_commit(pfStack_1b48,~(byte)__tv & 1);
          }
          unaff_R13 = (fdb_kvs_handle *)(ulong)((int)unaff_R13 + 1);
          __tv = ptVar10;
          uVar13 = uVar12;
        } while ((int)uVar12 < iStack_1b54);
      }
      pfVar17 = (fdb_kvs_handle *)0x1;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bc3f;
      fdb_commit(pfStack_1b48,'\x01');
      pfStack_1b68 = (fdb_kvs_handle *)0x11bc4e;
      fdb_get_kvs_info(pfStack_1b50,(fdb_kvs_info *)auStack_1af8);
      __tv = (timeval *)(auStack_1af8 + 8);
      if ((fdb_config *)auStack_1af8._8_8_ != (fdb_config *)(long)iStack_1b54) {
        pfStack_1b68 = (fdb_kvs_handle *)0x11bc6a;
        rollback_during_ops_test();
      }
      pfStack_1b68 = (fdb_kvs_handle *)0x11bc82;
      pthread_create(&pStack_1b40,(pthread_attr_t *)0x0,rollback_during_ops_test,&iStack_1b54);
      fconfig_01 = (fdb_config *)0x156958;
      pcVar14 = auStack_1b37;
      unaff_R12 = (fdb_kvs_handle *)0x1565bd;
      do {
        pfStack_1b68 = (fdb_kvs_handle *)0x11bca4;
        sprintf(pcVar14,"%d",pfVar17);
        unaff_R13 = pfStack_1b50;
        pfStack_1b68 = (fdb_kvs_handle *)0x11bcb1;
        sVar5 = strlen(pcVar14);
        pfStack_1b68 = (fdb_kvs_handle *)0x11bcc8;
        fVar2 = fdb_set_kv(unaff_R13,pcVar14,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011be65;
          pfStack_1b68 = (fdb_kvs_handle *)0x11bce4;
          fVar2 = fdb_commit(pfStack_1b48,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011be6a;
        }
        uVar13 = (int)pfVar17 + 1;
        pfVar17 = (fdb_kvs_handle *)(ulong)uVar13;
      } while (uVar13 != 0x2711);
      pfStack_1b68 = (fdb_kvs_handle *)0x11bd0a;
      pthread_join(pStack_1b40,(void **)(auStack_1b37 + 0xf));
      pfStack_1b68 = (fdb_kvs_handle *)0x11bd2d;
      fVar2 = fdb_set_kv(pfStack_1b50,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa2;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bd44;
      fVar2 = fdb_commit(pfStack_1b48,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfa7;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bd5e;
      fdb_get_kvs_info(pfStack_1b50,(fdb_kvs_info *)auStack_1af8);
      fconfig_01 = (fdb_config *)auStack_1af8._8_8_;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bd85;
      fVar2 = fdb_set_kv(pfStack_1b50,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfac;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bdb0;
      fVar2 = fdb_set_kv(pfStack_1b50,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb1;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bdc7;
      fVar2 = fdb_commit(pfStack_1b48,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfb6;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bddc;
      fVar2 = fdb_rollback(&pfStack_1b50,(fdb_seqnum_t)fconfig_01);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pfStack_1b68 = (fdb_kvs_handle *)0x11bdf6;
        fdb_get_kvs_info(pfStack_1b50,(fdb_kvs_info *)auStack_1af8);
        if ((fdb_config *)auStack_1af8._8_8_ != fconfig_01) {
          pfStack_1b68 = (fdb_kvs_handle *)0x11be07;
          rollback_during_ops_test();
        }
        pfStack_1b68 = (fdb_kvs_handle *)0x11be11;
        fdb_close(pfStack_1b48);
        pfStack_1b68 = (fdb_kvs_handle *)0x11be16;
        fdb_shutdown();
        pfStack_1b68 = (fdb_kvs_handle *)0x11be1b;
        memleak_end();
        pcVar14 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        pfStack_1b68 = (fdb_kvs_handle *)0x11be4c;
        fprintf(_stderr,pcVar14,"rollback during ops test");
        return;
      }
    }
    else {
      pfStack_1b68 = (fdb_kvs_handle *)0x11bf9d;
      rollback_during_ops_test();
LAB_0011bf9d:
      __tv = (timeval *)auStack_1af8;
      pfStack_1b68 = (fdb_kvs_handle *)0x11bfa2;
      rollback_during_ops_test();
LAB_0011bfa2:
      pfStack_1b68 = (fdb_kvs_handle *)0x11bfa7;
      rollback_during_ops_test();
LAB_0011bfa7:
      pfStack_1b68 = (fdb_kvs_handle *)0x11bfac;
      rollback_during_ops_test();
LAB_0011bfac:
      pfStack_1b68 = (fdb_kvs_handle *)0x11bfb1;
      rollback_during_ops_test();
LAB_0011bfb1:
      pfStack_1b68 = (fdb_kvs_handle *)0x11bfb6;
      rollback_during_ops_test();
LAB_0011bfb6:
      pfStack_1b68 = (fdb_kvs_handle *)0x11bfbb;
      rollback_during_ops_test();
    }
    pfStack_1b68 = (fdb_kvs_handle *)0x11bfc0;
    rollback_during_ops_test();
LAB_0011bfc0:
    pfStack_1b68 = (fdb_kvs_handle *)0x11bfc5;
    rollback_during_ops_test();
  }
  else {
LAB_0011be6f:
    fconfig_01 = (fdb_config *)auStack_1af8;
    pfStack_1b68 = (fdb_kvs_handle *)0x11be7c;
    fdb_get_default_config();
    pcVar14 = (char *)&fStack_1a00;
    pfStack_1b68 = (fdb_kvs_handle *)0x11be94;
    memcpy(pcVar14,fconfig_01,0xf8);
    fStack_1a00.block_reusing_threshold = 0;
    pfStack_1b68 = (fdb_kvs_handle *)0x11beb3;
    fVar2 = fdb_open(&pfStack_1b48,"mvcc_test1",(fdb_config *)pcVar14);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfc0;
    fconfig_01 = (fdb_config *)auStack_1af8;
    pfStack_1b68 = (fdb_kvs_handle *)0x11bec8;
    fdb_get_default_kvs_config();
    auStack_1b37._39_8_ = uStack_1ae8;
    auStack_1b37._23_8_ = auStack_1af8._0_8_;
    auStack_1b37._31_8_ = auStack_1af8._8_8_;
    pfStack_1b68 = (fdb_kvs_handle *)0x11beeb;
    fVar2 = fdb_kvs_open_default(pfStack_1b48,&pfStack_1b50,(fdb_kvs_config *)(auStack_1b37 + 0x17))
    ;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      iStack_1b54 = (int)__tv->tv_sec;
      if (1 < (long)iStack_1b54) {
        unaff_R13 = (fdb_kvs_handle *)0xcccccccd;
        fconfig_01 = (fdb_config *)0x156958;
        pcVar14 = auStack_1b37;
        unaff_R12 = (fdb_kvs_handle *)0x1565bd;
        __tv = (timeval *)(long)iStack_1b54;
        do {
          pfStack_1b68 = (fdb_kvs_handle *)0x11bf2c;
          sprintf(pcVar14,"%d",(ulong)__tv & 0xffffffff);
          pfVar17 = pfStack_1b50;
          pfStack_1b68 = (fdb_kvs_handle *)0x11bf39;
          sVar5 = strlen(pcVar14);
          pfStack_1b68 = (fdb_kvs_handle *)0x11bf50;
          fVar2 = fdb_set_kv(pfVar17,pcVar14,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfca;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            pfStack_1b68 = (fdb_kvs_handle *)0x11bf76;
            fVar2 = fdb_rollback(&pfStack_1b50,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfcf;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      pfStack_1b68 = (fdb_kvs_handle *)0x11bf91;
      fdb_close(pfStack_1b48);
      pfStack_1b68 = (fdb_kvs_handle *)0x11bf98;
      pthread_exit((void *)0x0);
    }
  }
  pfStack_1b68 = (fdb_kvs_handle *)0x11bfca;
  rollback_during_ops_test();
LAB_0011bfca:
  pfStack_1b68 = (fdb_kvs_handle *)0x11bfcf;
  rollback_during_ops_test();
LAB_0011bfcf:
  pfStack_1b68 = (fdb_kvs_handle *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  pfStack_1d20 = (fdb_kvs_handle *)0x11bff0;
  ptStack_1b88 = __tv;
  pfStack_1b80 = unaff_R12;
  pfStack_1b78 = unaff_R13;
  pfStack_1b70 = fconfig_01;
  pfStack_1b68 = (fdb_kvs_handle *)pcVar14;
  gettimeofday((timeval *)(auStack_1ce7 + 0xf),(__timezone_ptr_t)0x0);
  pfStack_1d20 = (fdb_kvs_handle *)0x11bff5;
  memleak_start();
  pfStack_1d20 = (fdb_kvs_handle *)0x11c001;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = &fStack_1c80;
  pfStack_1d20 = (fdb_kvs_handle *)0x11c011;
  fdb_get_default_config();
  pfStack_1d20 = (fdb_kvs_handle *)0x11c025;
  fVar2 = fdb_open(&pfStack_1d08,"mvcc_test1",fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00 = (fdb_config *)(auStack_1cc8 + 0x30);
    pfStack_1d20 = (fdb_kvs_handle *)0x11c03d;
    fdb_get_default_kvs_config();
    pfStack_1d20 = (fdb_kvs_handle *)0x11c04f;
    fVar2 = fdb_kvs_open_default(pfStack_1d08,&pfStack_1d10,(fdb_kvs_config *)fconfig_00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
    fconfig_00 = (fdb_config *)0x1;
    fconfig_01 = (fdb_config *)0x156958;
    pcVar14 = auStack_1ce7;
    unaff_R12 = (fdb_kvs_handle *)0x1565bd;
    do {
      pfStack_1d20 = (fdb_kvs_handle *)0x11c07e;
      sprintf(pcVar14,"%d",fconfig_00);
      unaff_R13 = pfStack_1d10;
      pfStack_1d20 = (fdb_kvs_handle *)0x11c08b;
      sVar5 = strlen(pcVar14);
      pfStack_1d20 = (fdb_kvs_handle *)0x11c0a2;
      fVar2 = fdb_set_kv(unaff_R13,pcVar14,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_1d20 = (fdb_kvs_handle *)0x11c266;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c266;
      }
      uVar13 = (int)fconfig_00 + 1;
      fconfig_00 = (fdb_config *)(ulong)uVar13;
    } while (uVar13 != 4);
    pfStack_1d20 = (fdb_kvs_handle *)0x11c0bd;
    fdb_commit(pfStack_1d08,'\0');
    pfStack_1d20 = (fdb_kvs_handle *)0x11c0e0;
    fVar2 = fdb_set_kv(pfStack_1d10,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c10b;
    fVar2 = fdb_set_kv(pfStack_1d10,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c122;
    fVar2 = fdb_commit(pfStack_1d08,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c139;
    fVar2 = fdb_rollback(&pfStack_1d10,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
    fconfig_00 = (fdb_config *)auStack_1cc8;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c153;
    fdb_get_kvs_info(pfStack_1d10,(fdb_kvs_info *)fconfig_00);
    if (auStack_1cc8._8_8_ != 3) {
      pfStack_1d20 = (fdb_kvs_handle *)0x11c164;
      in_memory_snapshot_rollback_test();
    }
    pfStack_1d20 = (fdb_kvs_handle *)0x11c17a;
    fVar2 = fdb_snapshot_open(pfStack_1d10,&pfStack_1cf0,0xffffffffffffffff);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
    pfStack_1d20 = (fdb_kvs_handle *)0x11c1a2;
    fdb_iterator_init(pfStack_1cf0,&pfStack_1d00,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_00 = (fdb_config *)&pfStack_1cf8;
    pfStack_1cf8 = (fdb_doc *)0x0;
    fconfig_01 = (fdb_config *)0x3;
    do {
      pfStack_1d20 = (fdb_kvs_handle *)0x11c1c1;
      fVar2 = fdb_iterator_get(pfStack_1d00,(fdb_doc **)fconfig_00);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
      pfStack_1d20 = (fdb_kvs_handle *)0x11c1d3;
      fdb_doc_free(pfStack_1cf8);
      pfStack_1cf8 = (fdb_doc *)0x0;
      pfStack_1d20 = (fdb_kvs_handle *)0x11c1e6;
      fVar2 = fdb_iterator_next(pfStack_1d00);
      fconfig_01 = (fdb_config *)&fconfig_01[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_01 == (fdb_config *)0x0) {
      pfStack_1d20 = (fdb_kvs_handle *)0x11c201;
      fdb_iterator_close(pfStack_1d00);
      pfStack_1d20 = (fdb_kvs_handle *)0x11c20b;
      fdb_kvs_close(pfStack_1cf0);
      pfStack_1d20 = (fdb_kvs_handle *)0x11c215;
      fdb_close(pfStack_1d08);
      pfStack_1d20 = (fdb_kvs_handle *)0x11c21a;
      fdb_shutdown();
      pfStack_1d20 = (fdb_kvs_handle *)0x11c21f;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_1d20 = (fdb_kvs_handle *)0x11c250;
      fprintf(_stderr,pcVar14,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c26b:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c270;
    in_memory_snapshot_rollback_test();
LAB_0011c270:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c275;
    in_memory_snapshot_rollback_test();
LAB_0011c275:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c27a;
    in_memory_snapshot_rollback_test();
LAB_0011c27a:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c27f;
    in_memory_snapshot_rollback_test();
LAB_0011c27f:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c284;
    in_memory_snapshot_rollback_test();
LAB_0011c284:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c289;
    in_memory_snapshot_rollback_test();
LAB_0011c289:
    pfStack_1d20 = (fdb_kvs_handle *)0x11c28e;
    in_memory_snapshot_rollback_test();
  }
  pfStack_1d20 = (fdb_kvs_handle *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_41d8 = (code *)0x11c2b0;
  pfStack_1d48 = fconfig_00;
  pfStack_1d40 = unaff_R12;
  pfStack_1d38 = unaff_R13;
  pfStack_1d30 = fconfig_01;
  pfStack_1d28 = (fdb_kvs_handle *)pcVar14;
  pfStack_1d20 = pfVar17;
  gettimeofday(&tStack_4160,(__timezone_ptr_t)0x0);
  pcStack_41d8 = (code *)0x11c2b5;
  memleak_start();
  pcStack_41d8 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_41d8 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_41d8 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_4048.wal_threshold = 0x400;
  fStack_4048.compaction_mode = 0;
  fStack_4048.durability_opt = 2;
  pfVar15 = (fdb_kvs_handle *)(apfStack_3e50 + 0x20);
  ppfVar11 = apfStack_4150;
  pcVar14 = "kvs%d";
  uVar21 = 0;
  __s_00 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_41d8 = (code *)0x11c31b;
    sprintf((char *)ppfVar11,"mvcc_test%d",(ulong)__s_00 & 0xffffffff);
    pcVar23 = (char *)(apfStack_41c0 + (long)__s_00);
    pcStack_41d8 = (code *)0x11c336;
    ppfVar20 = (fdb_kvs_handle **)pcVar23;
    fVar2 = fdb_open((fdb_file_handle **)pcVar23,(char *)ppfVar11,
                     (fdb_config *)(apfStack_4150 + 0x21));
    iVar3 = (int)ppfVar20;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar20 = (fdb_kvs_handle **)0x0;
    ppfStack_41d0 = __s_00;
    pfStack_41c8 = pfVar15;
    do {
      __s_00 = ppfVar20;
      pcStack_41d8 = (code *)0x11c35b;
      sprintf((char *)ppfVar11,"kvs%d",(ulong)(uint)((int)__s_00 + (int)uVar21));
      pfVar26 = *(fdb_kvs_handle **)pcVar23;
      pcStack_41d8 = (code *)0x11c36e;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar26,(fdb_kvs_handle **)pfVar15,(char *)ppfVar11,
                           (fdb_kvs_config *)(apfStack_41c0 + 9));
      iVar3 = (int)pfVar26;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_41d8 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar15 = (fdb_kvs_handle *)&(pfVar15->kvs_config).custom_cmp;
      ppfVar20 = (fdb_kvs_handle **)((long)__s_00 + 1);
    } while ((char *)((long)__s_00 + 1) != (char *)0x80);
    __s_00 = (fdb_kvs_handle **)((long)ppfStack_41d0 + 1);
    uVar21 = uVar21 + 0x80;
    pfVar15 = (fdb_kvs_handle *)&pfStack_41c8[1].bub_ctx.space_used;
  } while (__s_00 != (fdb_kvs_handle **)0x8);
  __s_00 = apfStack_4150 + 0x40;
  ppfVar11 = apfStack_3e50;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    uVar21 = 0;
    do {
      pcStack_41d8 = (code *)0x11c3cf;
      sprintf((char *)__s_00,"key%08d",uVar21);
      pcStack_41d8 = (code *)0x11c3e2;
      sprintf((char *)ppfVar11,"value%08d",uVar21);
      pcVar14 = (char *)apfStack_3e50[(long)&pfVar15->op_stats];
      pcStack_41d8 = (code *)0x11c3f2;
      sVar5 = strlen((char *)__s_00);
      pcVar23 = (char *)(sVar5 + 1);
      pcStack_41d8 = (code *)0x11c3fe;
      sVar5 = strlen((char *)ppfVar11);
      pcStack_41d8 = (code *)0x11c413;
      pfVar26 = (fdb_kvs_handle *)pcVar14;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar14,__s_00,(size_t)pcVar23,ppfVar11,sVar5 + 1);
      iVar3 = (int)pfVar26;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar13 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar13;
    } while (uVar13 != 10);
    pfVar15 = (fdb_kvs_handle *)&(pfVar15->kvs_config).field_0x1;
  } while (pfVar15 != (fdb_kvs_handle *)0x400);
  pcVar23 = (char *)0x0;
  do {
    pfVar26 = apfStack_41c0[(long)pcVar23];
    if (((ulong)pcVar23 & 1) == 0) {
      pcStack_41d8 = (code *)0x11c441;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar26,'\0');
      iVar3 = (int)pfVar26;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_41d8 = (code *)0x11c454;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar26,'\x01');
      iVar3 = (int)pfVar26;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar23 = (char *)((long)pcVar23 + 1);
  } while (pcVar23 != (char *)0x8);
  pcVar23 = "key%08d";
  __s_00 = apfStack_4150 + 0x40;
  ppfVar11 = (fdb_kvs_handle **)0x0;
  do {
    uVar21 = 0;
    do {
      pcStack_41d8 = (code *)0x11c488;
      sprintf((char *)__s_00,"key%08d",uVar21);
      pfVar15 = apfStack_3e50[(long)(ppfVar11 + 4)];
      pcStack_41d8 = (code *)0x11c498;
      sVar5 = strlen((char *)__s_00);
      pcStack_41d8 = (code *)0x11c4a7;
      pfVar26 = pfVar15;
      fVar2 = fdb_del_kv(pfVar15,__s_00,sVar5 + 1);
      iVar3 = (int)pfVar26;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar13 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar13;
    } while (uVar13 != 10);
    ppfVar11 = (fdb_kvs_handle **)((long)ppfVar11 + 1);
  } while (ppfVar11 != (fdb_kvs_handle **)0x400);
  pcVar23 = (char *)0x0;
  do {
    pfVar26 = apfStack_41c0[(long)pcVar23];
    if (((ulong)pcVar23 & 1) == 0) {
      pcStack_41d8 = (code *)0x11c4d5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar26,'\0');
      iVar3 = (int)pfVar26;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_41d8 = (code *)0x11c4e8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar26,'\x01');
      iVar3 = (int)pfVar26;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar23 = (char *)((long)pcVar23 + 1);
  } while (pcVar23 != (char *)0x8);
  __s_00 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar23 = (char *)(apfStack_3e50 + 0x20);
  do {
    pcStack_41d8 = (code *)0x11c515;
    ppfVar20 = (fdb_kvs_handle **)pcVar23;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar23,10);
    iVar3 = (int)ppfVar20;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    __s_00 = __s_00 + 8;
    pcVar23 = (char *)((long)pcVar23 + 0x200);
  } while (__s_00 < (fdb_kvs_handle **)0x3c0);
  ppfVar11 = apfStack_41c0;
  pcVar23 = "kvs%d";
  __s_00 = apfStack_4150;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfVar26 = apfStack_3e50[(long)&pfVar15->op_stats];
    pcStack_41d8 = (code *)0x11c555;
    fVar2 = fdb_kvs_close(pfVar26);
    iVar3 = (int)pfVar26;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_41d8 = (code *)0x11c56d;
    sprintf((char *)__s_00,"kvs%d",(ulong)pfVar15 & 0xffffffff);
    pfVar26 = *ppfVar11;
    pcStack_41d8 = (code *)0x11c579;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar26,(char *)__s_00);
    iVar3 = (int)pfVar26;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar15 = (fdb_kvs_handle *)&(pfVar15->config).wal_threshold;
    ppfVar11 = ppfVar11 + 1;
  } while (pfVar15 != (fdb_kvs_handle *)0x400);
  pcVar23 = (char *)0x0;
  do {
    pfVar26 = apfStack_41c0[(long)pcVar23];
    if (((ulong)pcVar23 & 1) == 0) {
      pcStack_41d8 = (code *)0x11c5a5;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar26,'\0');
      iVar3 = (int)pfVar26;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_41d8 = (code *)0x11c5b8;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar26,'\x01');
      iVar3 = (int)pfVar26;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar23 = (char *)((long)pcVar23 + 1);
  } while (pcVar23 != (char *)0x8);
  pcVar23 = "mvcc_test_compact%d";
  __s_00 = apfStack_4150;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_41d8 = (code *)0x11c5eb;
    sprintf((char *)__s_00,"mvcc_test_compact%d",(ulong)pfVar15 & 0xffffffff);
    pfVar26 = apfStack_41c0[(long)pfVar15];
    pcStack_41d8 = (code *)0x11c5f8;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar26,(char *)__s_00);
    iVar3 = (int)pfVar26;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar15 = (fdb_kvs_handle *)&(pfVar15->kvs_config).field_0x1;
  } while (pfVar15 != (fdb_kvs_handle *)0x8);
  pcVar23 = (char *)0x0;
  pcStack_41d8 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar26 = apfStack_41c0[(long)pcVar23];
    pcStack_41d8 = (code *)0x11c61c;
    fVar2 = fdb_close((fdb_file_handle *)pfVar26);
    iVar3 = (int)pfVar26;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar23 = (char *)((long)pcVar23 + 1);
    if (pcVar23 == (char *)0x8) {
      pcStack_41d8 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_41d8 = (code *)0x11c633;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pcStack_41d8 = (code *)0x11c664;
      fprintf(_stderr,pcVar14,"open multi files kvs test");
      return;
    }
  }
LAB_0011c69e:
  pcStack_41d8 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_41d8 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_41d8 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_41d8 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_41d8 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_41d8 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_41d8 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_46e0 = (code *)0x11c6e3;
  ppfStack_4200 = (fdb_kvs_handle **)pcVar23;
  ppfStack_41f8 = ppfVar11;
  pfStack_41f0 = (fdb_kvs_handle *)pcVar14;
  ppfStack_41e8 = __s_00;
  pfStack_41e0 = pfVar15;
  pcStack_41d8 = (code *)uVar21;
  gettimeofday(&tStack_4658,(__timezone_ptr_t)0x0);
  pcStack_46e0 = (code *)0x11c6e8;
  memleak_start();
  pcStack_46e0 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_46e0 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_42f8.flags = 1;
  fStack_42f8.block_reusing_threshold = 0;
  fStack_42f8.seqtree_opt = 0;
  pcStack_46e0 = (code *)0x11c728;
  fStack_42f8.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_46e0 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_46c8,"./mvcc_test1",(fdb_config *)(acStack_43f8 + 0x100));
  iStack_46a4 = iVar3;
  if (iVar3 == 0) {
    pcStack_46e0 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_46c8,apfStack_4698,&fStack_4678);
    pcVar14 = (char *)0x1;
  }
  else {
    ppfVar11 = apfStack_4698;
    uVar21 = 0;
    do {
      pcStack_46e0 = (code *)0x11c76d;
      sprintf(acStack_4660,"kv%d",uVar21 & 0xffffffff);
      pcStack_46e0 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_46c8,ppfVar11,acStack_4660,&fStack_4678);
      uVar21 = uVar21 + 1;
      ppfVar11 = ppfVar11 + 1;
    } while (uVar21 != 3);
    pcVar14 = (char *)0x3;
  }
  uStack_46cc = 0;
  do {
    uVar21 = 0;
    do {
      pcStack_46e0 = (code *)0x11c7d4;
      sprintf(acStack_44f8,"key%d",uVar21 & 0xffffffff);
      pcStack_46e0 = (code *)0x11c7f5;
      sprintf(acStack_4648,"meta-%d-%d",(ulong)uStack_46cc,uVar21 & 0xffffffff);
      pcStack_46e0 = (code *)0x11c814;
      sprintf(acStack_43f8,"body-%d-%d",(ulong)uStack_46cc,uVar21 & 0xffffffff);
      doc_00 = (btree *)(&bStack_4548.ksize + uVar21 * 8);
      pcStack_46e0 = (code *)0x11c827;
      sVar5 = strlen(acStack_44f8);
      pcStack_46e0 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_4648);
      pcStack_46e0 = (code *)0x11c842;
      sVar6 = strlen(acStack_43f8);
      pcStack_46e0 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc_00,acStack_44f8,sVar5,acStack_4648,metalen._M_i,acStack_43f8,
                     sVar6);
      pfVar15 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_46e0 = (code *)0x11c878;
        fdb_set(apfStack_4698[(long)pfVar15],*(fdb_doc **)doc_00);
        pfVar15 = (fdb_kvs_handle *)((long)pfVar15 + 1);
      } while ((fdb_kvs_handle *)pcVar14 != pfVar15);
      pcStack_46e0 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_4548.ksize + uVar21 * 8));
      uVar21 = uVar21 + 1;
    } while (uVar21 != 10);
    pcStack_46e0 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_46c8,~(byte)uStack_46cc & 1);
    uStack_46cc = uStack_46cc + 1;
    pcVar23 = (char *)(ulong)uStack_46cc;
  } while (uStack_46cc != 5);
  pcStack_46e0 = (code *)0x11c8d4;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_46c8,&pfStack_46b0,&uStack_4680);
  pfVar26 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_46e0 = (code *)0x11c8f3;
    fVar2 = fdb_rollback(apfStack_4698,(pfStack_46b0[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_46c0 = (fdb_kvs_handle *)0x0;
    pcVar23 = acStack_43f8;
    pfVar26 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_46e0 = (code *)0x11c928;
      fVar2 = fdb_snapshot_open(apfStack_4698[(long)pfVar26],&pfStack_46a0,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_46e0 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_46e0 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_46e0 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_46e0 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_46e0 = (code *)0x11c950;
      fVar2 = fdb_iterator_init(pfStack_46a0,&pfStack_46b8,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_46e0 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_46e0 = (code *)0x11c96a;
        fVar2 = fdb_iterator_get(pfStack_46b8,(fdb_doc **)&pfStack_46c0);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_46e0 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_46e0 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_46e0 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_46e0 = (code *)0x11c98b;
        sprintf(acStack_44f8,"key%d",metalen._M_i);
        if (pfVar26 == (fdb_kvs_handle *)0x0) {
          pcStack_46e0 = (code *)0x11c9da;
          sprintf(acStack_4648,"meta-1-%d",metalen._M_i);
          pcStack_46e0 = (code *)0x11c9ee;
          sprintf(pcVar23,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_46e0 = (code *)0x11c9ae;
          sprintf(acStack_4648,"meta-%d-%d",4,metalen._M_i);
          pcStack_46e0 = (code *)0x11c9c7;
          sprintf(pcVar23,"body-%d-%d",4);
        }
        pfVar15 = pfStack_46c0;
        doc_00 = (btree *)pfStack_46c0->op_stats;
        pcStack_46e0 = (code *)0x11ca0a;
        iVar3 = bcmp(doc_00,acStack_44f8,*(size_t *)&pfStack_46c0->kvs_config);
        if (iVar3 != 0) {
          pcStack_46e0 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc_00 = pfVar15->staletree;
        pcStack_46e0 = (code *)0x11ca2a;
        iVar3 = bcmp(doc_00,acStack_4648,(size_t)(pfVar15->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cba4;
        doc_00 = (pfVar15->field_6).seqtree;
        pcStack_46e0 = (code *)0x11ca45;
        iVar3 = bcmp(doc_00,pcVar23,(size_t)(pfVar15->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011cb94;
        pcStack_46e0 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar15);
        pfStack_46c0 = (fdb_kvs_handle *)0x0;
        uVar13 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar13;
        pcStack_46e0 = (code *)0x11ca6b;
        fVar2 = fdb_iterator_next(pfStack_46b8);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar13 != 10) goto LAB_0011cbbe;
      pcStack_46e0 = (code *)0x11ca88;
      fVar2 = fdb_iterator_close(pfStack_46b8);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_46e0 = (code *)0x11ca9a;
      fVar2 = fdb_kvs_close(pfStack_46a0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar26 = (fdb_kvs_handle *)&(pfVar26->kvs_config).field_0x1;
    } while (pfVar26 != (fdb_kvs_handle *)pcVar14);
    pcVar23 = (char *)0x0;
    do {
      pcStack_46e0 = (code *)0x11caba;
      fVar2 = fdb_kvs_close(apfStack_4698[(long)pcVar23]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar23 = pcVar23 + 1;
    } while (pcVar14 != pcVar23);
    pcStack_46e0 = (code *)0x11cadd;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_46c8,pfStack_46b0[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_46e0 = (code *)0x11caf4;
    fVar2 = fdb_free_snap_markers(pfStack_46b0,uStack_4680);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_46e0 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_46c8);
      pcStack_46e0 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_46e0 = (code *)0x11cb10;
      memleak_end();
      pcVar14 = "single kv mode:";
      if ((char)iStack_46a4 != '\0') {
        pcVar14 = "multiple kv mode:";
      }
      pcStack_46e0 = (code *)0x11cb40;
      sprintf(acStack_43f8,"rollback without seqtree in %s",pcVar14);
      pcVar14 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pcStack_46e0 = (code *)0x11cb6d;
      fprintf(_stderr,pcVar14,acStack_43f8);
      return;
    }
  }
  else {
LAB_0011cbd2:
    pcStack_46e0 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_46e0 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_46e0 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_46e0 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_48b8 = (fdb_kvs_handle *)0x11cc03;
  pcStack_4708 = pcVar23;
  aStack_4700.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_46f8 = doc_00;
  pfStack_46f0 = pfVar15;
  pfStack_46e8 = pfVar26;
  pcStack_46e0 = (code *)pcVar14;
  gettimeofday(&tStack_4858,(__timezone_ptr_t)0x0);
  pfStack_48b8 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_48b8 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar14 = auStack_4848 + 0x48;
  pfStack_48b8 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_48b8 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&pfStack_48b0,"./mvcc_test2",(fdb_config *)pcVar14);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar14 = auStack_4848;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_4860 = (btreeblk_handle *)auStack_4848._16_8_;
    pfStack_4870 = (filemgr *)auStack_4848._0_8_;
    pdStack_4868 = (docio_handle *)auStack_4848._8_8_;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cc6c;
    fVar2 = fdb_kvs_open_default(pfStack_48b0,&pfStack_48a8,(fdb_kvs_config *)&pfStack_4870);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cc82;
    fVar2 = fdb_begin_transaction(pfStack_48b0,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar14 = "key%d";
    pfVar15 = (fdb_kvs_handle *)acStack_489f;
    pfVar26 = (fdb_kvs_handle *)0x1565bd;
    uVar21 = 0;
    do {
      pfStack_48b8 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar15,"key%d",uVar21);
      pfVar18 = pfStack_48a8;
      pfStack_48b8 = (fdb_kvs_handle *)0x11ccbb;
      sVar5 = strlen((char *)pfVar15);
      pfStack_48b8 = (fdb_kvs_handle *)0x11ccd2;
      fVar2 = fdb_set_kv(pfVar18,pfVar15,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_48b8 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar13 = (int)uVar21 + 1;
      uVar21 = (ulong)uVar13;
    } while (uVar13 != 10);
    pfStack_48b8 = (fdb_kvs_handle *)0x11ccef;
    fVar2 = fdb_end_transaction(pfStack_48b0,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_48b0,"./mvcc_test3");
    pfStack_48b8 = (fdb_kvs_handle *)0x11cd15;
    fVar2 = fdb_begin_transaction(pfStack_48b0,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar14 = "key%d";
    pfVar15 = (fdb_kvs_handle *)acStack_489f;
    uVar13 = 0;
    do {
      pfStack_48b8 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar15,"key%d",(ulong)uVar13);
      pfVar26 = pfStack_48a8;
      pfStack_48b8 = (fdb_kvs_handle *)0x11cd47;
      sVar5 = strlen((char *)pfVar15);
      pfStack_48b8 = (fdb_kvs_handle *)0x11cd55;
      fVar2 = fdb_del_kv(pfVar26,pfVar15,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar13 = uVar13 + 1;
    } while (uVar13 != 10);
    pfStack_48b8 = (fdb_kvs_handle *)0x11cd72;
    fVar2 = fdb_get_file_info(pfStack_48b0,(fdb_file_info *)auStack_4848);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar14 = (char *)((ulong)auStack_4848._40_8_ / (ulong)uStack_47fc);
    pfStack_48b8 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_48b0);
    pfStack_48b8 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_48b8 = (fdb_kvs_handle *)0x11cdbe;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_47fc * (long)pcVar14,
                       (ulong)((uStack_47fc >> 2) + uStack_47fc * 2));
    if (iVar3 < 0) goto LAB_0011cf90;
    pfStack_48b8 = (fdb_kvs_handle *)0x11cde8;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar14 * 4 + 8) * (ulong)uStack_47fc,
                       (ulong)(uStack_47fc >> 2));
    if (iVar3 < 0) goto LAB_0011cf95;
    pfStack_48b8 = (fdb_kvs_handle *)0x11ce07;
    fVar2 = fdb_open(&pfStack_48b0,"./mvcc_test3",(fdb_config *)(auStack_4848 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar14 = (char *)&pfStack_4890;
    pfStack_48b8 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_4860 = pbStack_4880;
    pfStack_4870 = pfStack_4890;
    pdStack_4868 = pdStack_4888;
    pfStack_48b8 = (fdb_kvs_handle *)0x11ce3d;
    fVar2 = fdb_kvs_open_default(pfStack_48b0,&pfStack_48a8,(fdb_kvs_config *)&pfStack_4870);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_48b8 = (fdb_kvs_handle *)0x11ce53;
    fVar2 = fdb_begin_transaction(pfStack_48b0,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar13 = 0;
      do {
        pfStack_48b8 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_489f,"key%d",(ulong)uVar13);
        pfVar26 = pfStack_48a8;
        pfStack_48b8 = (fdb_kvs_handle *)0x11ce85;
        sVar5 = strlen(acStack_489f);
        pfStack_48b8 = (fdb_kvs_handle *)0x11ce93;
        fVar2 = fdb_del_kv(pfVar26,acStack_489f,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar13 = uVar13 + 1;
      } while (uVar13 != 10);
      pfStack_48b8 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_48b0);
      pfVar26 = (fdb_kvs_handle *)&pfStack_4890;
      uVar13 = 0;
      while( true ) {
        pfStack_48b8 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_489f,"key%d",(ulong)uVar13);
        pfVar15 = pfStack_48a8;
        pfStack_48b8 = (fdb_kvs_handle *)0x11cedf;
        sVar5 = strlen(acStack_489f);
        pfStack_48b8 = (fdb_kvs_handle *)0x11cef3;
        fVar2 = fdb_get_kv(pfVar15,acStack_489f,sVar5,(void **)pfVar26,&sStack_4878);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_48b8 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_4890);
        uVar13 = uVar13 + 1;
        if (uVar13 == 10) {
          pfStack_48b8 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_48b0);
          pfStack_48b8 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_48b8 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar14 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          pfStack_48b8 = (fdb_kvs_handle *)0x11cf4c;
          fprintf(_stderr,pcVar14,"crash recover test");
          return;
        }
      }
LAB_0011cf6d:
      pfVar15 = (fdb_kvs_handle *)acStack_489f;
      pcVar14 = "key%d";
      pfStack_48b8 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_48b8 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_48b8 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_48c8 = (fdb_config *)pcVar14;
  pfStack_48c0 = pfVar15;
  pfStack_48b8 = pfVar26;
  gettimeofday(&tStack_49e8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_49f8 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_4a08,"./mvcc_test1",&fStack_49c0);
  fdb_kvs_open_default(pfStack_4a08,&pfStack_49f0,&fStack_49d8);
  fdb_kvs_open(pfStack_4a08,&pfStack_4a10,"kv",&fStack_49d8);
  fVar2 = fdb_set_kv(pfStack_4a10,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_4a10,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_4a08,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_4a10,&pfStack_4a18,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_4a18,&pfStack_4a00,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_4a18);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_4a10);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_4a08,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_4a00,&pfStack_49f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_49f8);
    fVar2 = fdb_iterator_close(pfStack_4a00);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_4a18);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_49f0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_4a08);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar14 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar14 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar14,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_to_zero_after_compact_test(bool multi_kv)
{
    TEST_INIT();

    int i, r;
    const int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_kvs_handle *db[4]; // same as num_kvs
    fdb_file_handle *dbfile, *dbfile_comp;
    fdb_doc *doc[n];
    fdb_kvs_info info;
    fdb_status status;

    char keybuf[64], metabuf[64], bodybuf[64];
    char kv_name[8];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                         (void *) "rollback_to_zero_after_compact_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // open db
    status = fdb_open(&dbfile_comp, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_compact(dbfile_comp, "./mvcc_test2");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(dbfile_comp);

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_rollback(&db[r], 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_get_kvs_info(db[r], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == 0);
        TEST_CHK(info.doc_count == 0);
        TEST_CHK(info.space_used == 0);
        status = fdb_get(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        // test normal operation after rollback
        status = fdb_set(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // test normal operation after rollbacks manually flush WAL & commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    sprintf(bodybuf, "rollback to zero after compact test %s",
            multi_kv ? "multiple kv mode:" : "single kv mode:");
    TEST_RESULT(bodybuf);
}